

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_std::pair<unsigned_long,_unsigned_long>_&,_const_std::pair<unsigned_long,_unsigned_long>_&>
* __thiscall
Catch::ExprLhs<std::pair<unsigned_long,unsigned_long>const&>::operator==
          (BinaryExpr<const_std::pair<unsigned_long,_unsigned_long>_&,_const_std::pair<unsigned_long,_unsigned_long>_&>
           *__return_storage_ptr__,ExprLhs<std::pair<unsigned_long,unsigned_long>const&> *this,
          pair<unsigned_long,_unsigned_long> *rhs)

{
  pair<unsigned_long,_unsigned_long> *ppVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  StringRef local_40;
  
  ppVar1 = *(pair<unsigned_long,_unsigned_long> **)this;
  uVar2 = ppVar1->first;
  uVar3 = rhs->first;
  uVar4 = rhs->second;
  uVar5 = ppVar1->second;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar4 == uVar5 && uVar2 == uVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002c1798;
  __return_storage_ptr__->m_lhs = ppVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }